

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sys_error.cc
# Opt level: O1

char * __thiscall ixxx::sys_error::what(sys_error *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int __ecode;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  __ptr;
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  ostringstream o;
  array<char,_256UL> buffer;
  undefined1 auStack_298 [8];
  long local_290 [14];
  ios_base local_220 [264];
  char local_118 [256];
  
  this_00 = &this->what_;
  if ((this->what_)._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
    pcVar1 = (char *)(**(code **)(*(long *)this + 0x20))(this);
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)auStack_298 + (int)*(undefined8 *)(local_290[0] + -0x18) + 8);
    }
    else {
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar1,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,": ",2);
    __ecode = this->errno_;
    if (__ecode != 0) {
      if (this->type_ == 1) {
        pcVar1 = gai_strerror(__ecode);
      }
      else if (this->type_ == 0) {
        local_118[0] = '\0';
        pcVar1 = strerror_r(__ecode,local_118,0x100);
      }
      else {
        pcVar1 = (char *)0x0;
      }
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)auStack_298 + (int)*(undefined8 *)(local_290[0] + -0x18) + 8);
      }
      else {
        sVar2 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar1,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290," (",2);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_290,this->errno_);
      local_118[0] = ')';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_118,1);
    }
    if (this->literal_ != (char *)0x0) {
      if (this->errno_ != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290," - ",3);
      }
      pcVar1 = this->literal_;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)auStack_298 + (int)*(undefined8 *)(local_290[0] + -0x18) + 8);
      }
      else {
        sVar2 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar1,sVar2);
      }
    }
    _Var4._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
    std::__cxx11::stringbuf::str();
    __ptr._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = _Var4._M_head_impl;
    if (__ptr._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this_00,__ptr._M_head_impl);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
    std::ios_base::~ios_base(local_220);
  }
  return (((this_00->_M_t).
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl)->_M_dataplus)._M_p;
}

Assistant:

const char* sys_error::what() const noexcept
    {
        if (!what_) {
            std::ostringstream o;
            o << name() << ": ";
            if (errno_) {
                const char* errno_s = nullptr;
                switch (type_) {
                    case ERRNO:
                        {
                            std::array<char, 256> buffer;
                            errno_s = buffer.data();
                            buffer[0] = 0;
                            // g++ unconditionally defines _GNU_SOURCE
                            // https://bugs.debian.org/cgi-bin/bugreport.cgi?bug=485135
                            // http://stackoverflow.com/questions/11670581/why-is-gnu-source-defined-by-default-and-how-to-turn-it-off
#ifdef _GNU_SOURCE
                            // this API makes more sense as it avoids a copy in the good case
                            errno_s = ::strerror_r(errno_, buffer.data(), buffer.size());
#else
#if defined(__MINGW32__) || defined(__MINGW64__)
                            // cf. sec_api/string_s.h
                            int r = strerror_s(buffer.data(), buffer.size(), errno_);
#else
                            int r = ::strerror_r(errno_, buffer.data(), buffer.size());
#endif
                            if (r)
                                buffer[buffer.size()-1] = 0;
#endif
                        }
                        break;
                    case GAI:
                        errno_s = gai_strerror(errno_);
                        break;
                }
                o << errno_s << " (" << errno_ << ')';
            }
            if (literal_) {
                if (errno_)
                    o << " - ";
                o << literal_;
            }
            what_.reset(new std::string(o.str()));
        }
        return what_->c_str();
    }